

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O0

void anon_unknown.dwarf_1412e7::setInputDeepFrameBuffer
               (DeepFrameBuffer *frameBuffer,int pixelType,Array2D<unsigned_int_*> *uData,
               Array2D<float_*> *fData,Array2D<half_*> *hData,int width,int height)

{
  Array2D<float_*> *in_RCX;
  Array2D<unsigned_int_*> *in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  undefined2 uVar1;
  Array2D<half_*> *in_R8;
  DeepSlice *in_stack_00000190;
  char *in_stack_00000198;
  DeepFrameBuffer *in_stack_000001a0;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  long in_stack_ffffffffffffff08;
  Array2D<half_*> *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  undefined2 uVar2;
  undefined4 in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  PixelType in_stack_ffffffffffffff4c;
  DeepSlice *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  
  uVar1 = (undefined2)((ulong)in_RDI >> 0x30);
  uVar2 = (undefined2)((ulong)in_stack_ffffffffffffff18 >> 0x30);
  if (in_ESI == 0) {
    Imf_2_5::Array2D<unsigned_int_*>::resizeErase
              ((Array2D<unsigned_int_*> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    Imf_2_5::Array2D<unsigned_int_*>::operator[](in_RDX,0);
    Imf_2_5::DeepSlice::DeepSlice
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,
               (double)CONCAT44(in_ESI,in_stack_ffffffffffffff20),SUB21((ushort)uVar1 >> 8,0),
               SUB21(uVar1,0));
    Imf_2_5::DeepFrameBuffer::insert(in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  }
  else if (in_ESI == 1) {
    Imf_2_5::Array2D<float_*>::resizeErase
              ((Array2D<float_*> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    Imf_2_5::Array2D<float_*>::operator[](in_RCX,0);
    Imf_2_5::DeepSlice::DeepSlice
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,
               (double)CONCAT44(in_ESI,in_stack_ffffffffffffff20),SUB21((ushort)uVar2 >> 8,0),
               SUB21(uVar2,0));
    Imf_2_5::DeepFrameBuffer::insert(in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  }
  else if (in_ESI == 2) {
    Imf_2_5::Array2D<half_*>::resizeErase
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    Imf_2_5::Array2D<half_*>::operator[](in_R8,0);
    Imf_2_5::DeepSlice::DeepSlice
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,
               (double)CONCAT44(in_ESI,in_stack_ffffffffffffff20),SUB21((ushort)uVar2 >> 8,0),
               SUB21(uVar2,0));
    Imf_2_5::DeepFrameBuffer::insert(in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  }
  return;
}

Assistant:

void
setInputDeepFrameBuffer (DeepFrameBuffer& frameBuffer,
                         int pixelType,
                         Array2D<unsigned int*>& uData,
                         Array2D<float*>& fData,
                         Array2D<half*>& hData,
                         int width, int height)
{
    switch (pixelType)
    {
        case 0:
            uData.resizeErase(height, width);
            frameBuffer.insert ("UINT",
                                DeepSlice (IMF::UINT,
                                (char *) (&uData[0][0]),
                                sizeof (uData[0][0]) * 1,
                                sizeof (uData[0][0]) * width,
                                sizeof (unsigned int)));
            break;
        case 1:
            fData.resizeErase(height, width);
            frameBuffer.insert ("FLOAT",
                                DeepSlice (IMF::FLOAT,
                                (char *) (&fData[0][0]),
                                sizeof (fData[0][0]) * 1,
                                sizeof (fData[0][0]) * width,
                                sizeof (float)));
            break;
        case 2:
            hData.resizeErase(height, width);
            frameBuffer.insert ("HALF",
                                DeepSlice (IMF::HALF,
                                (char *) (&hData[0][0]),
                                sizeof (hData[0][0]) * 1,
                                sizeof (hData[0][0]) * width,
                                sizeof (half)));
            break;
    }
}